

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O2

bool ot::commissioner::tlv::IsDatasetParameter(bool aIsActiveDataset,Type aTlvType)

{
  int iVar1;
  size_type sVar2;
  set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
  *this;
  initializer_list<ot::commissioner::tlv::Type> __l;
  initializer_list<ot::commissioner::tlv::Type> __l_00;
  allocator_type local_23;
  less<ot::commissioner::tlv::Type> local_22;
  Type aTlvType_local;
  Type local_20 [8];
  undefined4 local_18;
  
  aTlvType_local = aTlvType;
  if (IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kActiveSet == '\0') {
    iVar1 = __cxa_guard_acquire(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kActiveSet);
    if (iVar1 != 0) {
      local_20[0] = kActiveTimestamp;
      local_20[1] = kChannel;
      local_20[2] = kChannelMask;
      local_20[3] = kExtendedPanId;
      local_20[4] = kNetworkDiagNetworkData;
      local_20[5] = kNetworkDiagRoute64;
      local_20[6] = kNetworkDiagTimeout;
      local_20[7] = kNetworkDiagMacAddress;
      local_18 = CONCAT22(local_18._2_2_,0xc04);
      __l._M_len = 10;
      __l._M_array = local_20;
      std::
      set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
      ::set(&IsDatasetParameter::kActiveSet,__l,&local_22,&local_23);
      __cxa_atexit(std::
                   set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
                   ::~set,&IsDatasetParameter::kActiveSet,&__dso_handle);
      __cxa_guard_release(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kActiveSet);
    }
  }
  if (IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kPendingSet == '\0') {
    iVar1 = __cxa_guard_acquire(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kPendingSet);
    if (iVar1 != 0) {
      local_20[0] = kActiveTimestamp;
      local_20[1] = kChannel;
      local_20[2] = kChannelMask;
      local_20[3] = kDelayTimer;
      local_20[4] = kExtendedPanId;
      local_20[5] = kNetworkDiagNetworkData;
      local_20[6] = kNetworkDiagRoute64;
      local_20[7] = kNetworkDiagTimeout;
      local_18 = 0xc043301;
      __l_00._M_len = 0xc;
      __l_00._M_array = local_20;
      std::
      set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
      ::set(&IsDatasetParameter::kPendingSet,__l_00,&local_22,&local_23);
      __cxa_atexit(std::
                   set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
                   ::~set,&IsDatasetParameter::kPendingSet,&__dso_handle);
      __cxa_guard_release(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kPendingSet);
    }
  }
  this = &IsDatasetParameter::kPendingSet;
  if (aIsActiveDataset) {
    this = &IsDatasetParameter::kActiveSet;
  }
  sVar2 = std::
          set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
          ::count(this,&aTlvType_local);
  return sVar2 != 0;
}

Assistant:

bool IsDatasetParameter(bool aIsActiveDataset, tlv::Type aTlvType)
{
    static const std::set<tlv::Type> kActiveSet = {tlv::Type::kActiveTimestamp,
                                                   tlv::Type::kChannel,
                                                   tlv::Type::kChannelMask,
                                                   tlv::Type::kExtendedPanId,
                                                   tlv::Type::kNetworkMeshLocalPrefix,
                                                   tlv::Type::kNetworkMasterKey,
                                                   tlv::Type::kNetworkName,
                                                   tlv::Type::kPanId,
                                                   tlv::Type::kPSKc,
                                                   tlv::Type::kSecurityPolicy};

    static const std::set<tlv::Type> kPendingSet = {
        tlv::Type::kActiveTimestamp,  tlv::Type::kChannel,       tlv::Type::kChannelMask,
        tlv::Type::kDelayTimer,       tlv::Type::kExtendedPanId, tlv::Type::kNetworkMeshLocalPrefix,
        tlv::Type::kNetworkMasterKey, tlv::Type::kNetworkName,   tlv::Type::kPanId,
        tlv::Type::kPendingTimestamp, tlv::Type::kPSKc,          tlv::Type::kSecurityPolicy};

    return (aIsActiveDataset ? kActiveSet : kPendingSet).count(aTlvType) != 0;
}